

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

void QTest::qtest_qParseArgs(int argc,char **argv,bool qml)

{
  char *pcVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QBenchmarkGlobalData *pQVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  char *__s1;
  undefined8 extraout_RAX;
  Mode mode;
  storage_type *psVar11;
  int iVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  LogMode local_78;
  char *local_70;
  QString local_58;
  QFileInfo local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  repetitions = 1;
  QList<QString>::clear((QList<QString> *)testFunctions);
  QList<QString>::clear((QList<QString> *)&testTags);
  if (argc < 2) {
    local_78 = ~Plain;
    local_70 = (char *)0x0;
LAB_0012d042:
    QTestResult::currentAppName();
    QTestResult::currentTestObjectName();
    QTestLog::setInstalledTestCoverage(false);
    bVar7 = QTestLog::hasLoggers();
    if (!bVar7 && local_78 != ~Plain) {
      QTestLog::addLogger(local_78,local_70);
    }
    if (local_78 == ~Plain) {
      QTestLog::addLogger(Plain,local_70);
    }
    if ((repetitions == 1) || (bVar7 = QTestLog::isRepeatSupported(), bVar7)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      qtest_qParseArgs();
LAB_0012d13d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qtest_qParseArgs();
LAB_0012d156:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qtest_qParseArgs();
LAB_0012d16f:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            qtest_qParseArgs();
LAB_0012d188:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              qtest_qParseArgs();
LAB_0012d1a1:
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                qtest_qParseArgs();
LAB_0012d1ba:
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  qtest_qParseArgs();
LAB_0012d1d3:
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    qtest_qParseArgs();
LAB_0012d1ec:
                    QBenchmarkPerfEventsMeasurer::listCounters();
LAB_0012d0f2:
                    exit(0);
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0012d381:
    __stack_chk_fail();
  }
  iVar12 = 1;
  local_78 = ~Plain;
  local_70 = (char *)0x0;
LAB_0012c609:
  pcVar1 = argv[iVar12];
  iVar8 = strcmp(pcVar1,"-help");
  if (((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--help"), iVar8 == 0)) ||
     (iVar8 = strcmp(pcVar1,"/?"), iVar8 == 0)) {
    printf(" Usage: %s [options] [testfunction[:testdata]]...\n    By default, all testfunctions will be run.\n\n%s"
           ,*argv,
           " New-style logging options:\n -o filename,format  : Output results to file in the specified format\n                       Use - to output to stdout\n                       Valid formats are:\n                         txt      : Plain text\n                         csv      : CSV format (suitable for benchmarks)\n                         junitxml : XML JUnit document\n                         xml      : XML document\n                         lightxml : A stream of XML tags\n                         teamcity : TeamCity format\n                         tap      : Test Anything Protocol\n\n     *** Multiple loggers can be specified, but at most one can log to stdout.\n\n Old-style logging options:\n -o filename         : Write the output into file\n -txt                : Output results in Plain Text\n -csv                : Output results in a CSV format (suitable for benchmarks)\n -junitxml           : Output results as XML JUnit document\n -xml                : Output results as XML document\n -lightxml           : Output results as stream of XML tags\n -teamcity           : Output results in TeamCity format\n -tap                : Output results in Test Anything Protocol format\n\n     *** If no output file is specified, stdout is assumed.\n     *** If no output format is specified, -txt is assumed.\n\n Test log detail options:\n -silent             : Log failures and fatal errors only\n -v1                 : Log the start of each testfunction\n -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n -vs                 : Log every signal emission and resulting slot invocations\n\n     *** The -silent and -v1 options only affect plain text output.\n\n Testing options:\n -functions          : Returns a list of current testfunctions\n -datatags           : Returns a list of current data tags.\n                       A global data tag is preceded by \' __global__ \'.\n -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n..." /* TRUNCATED STRING LITERAL */
          );
    if (qml) {
      puts(
          "\n QmlTest options:\n -import dir         : Specify an import directory.\n -plugins dir        : Specify a directory where to search for plugins.\n -input dir/file     : Specify the root directory for test cases or a single test case file.\n -translation file   : Specify the translation file.\n -file-selector dir  : Specify a file selector for the QML engine."
          );
    }
    puts("\n -help               : This help");
    goto LAB_0012d0f2;
  }
  iVar8 = strcmp(pcVar1,"-functions");
  if (iVar8 == 0) {
    if (qml) {
      printAvailableFunctions = 1;
      goto LAB_0012ca0d;
    }
    qPrintTestSlots(_stdout,(char *)0x0,"");
    goto LAB_0012d0f2;
  }
  iVar8 = strcmp(pcVar1,"-datatags");
  if (iVar8 == 0) {
    if (qml) goto LAB_0012ca0d;
    qPrintDataTags(_stdout);
    goto LAB_0012d0f2;
  }
  iVar8 = strcmp(pcVar1,"-txt");
  if (iVar8 == 0) {
    local_78 = Plain;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-csv");
  if (iVar8 == 0) {
    local_78 = CSV;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-junitxml");
  if (iVar8 == 0) {
LAB_0012ca03:
    local_78 = JUnitXML;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-xunitxml");
  if (iVar8 == 0) {
    qtest_qParseArgs();
    goto LAB_0012ca03;
  }
  iVar8 = strcmp(pcVar1,"-xml");
  if (iVar8 == 0) {
    local_78 = XML;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-lightxml");
  if (iVar8 == 0) {
    local_78 = LightXML;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-teamcity");
  if (iVar8 == 0) {
    local_78 = TeamCity;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-tap");
  if (iVar8 == 0) {
    local_78 = TAP;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-silent");
  if (iVar8 == 0) {
    iVar8 = -1;
LAB_0012ca31:
    QTestLog::setVerboseLevel(iVar8);
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-v1");
  if (iVar8 == 0) {
    iVar8 = 1;
    goto LAB_0012ca31;
  }
  iVar8 = strcmp(pcVar1,"-v2");
  if (iVar8 == 0) {
    iVar8 = 2;
    goto LAB_0012ca31;
  }
  iVar8 = strcmp(pcVar1,"-vs");
  if (iVar8 == 0) {
    QSignalDumper::setEnabled(true);
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-o");
  if (iVar8 == 0) {
    iVar12 = iVar12 + 1;
    if (argc <= iVar12) goto LAB_0012d13d;
    pcVar1 = argv[iVar12];
    sVar9 = strlen(pcVar1);
    pcVar10 = (char *)operator_new__(sVar9 + 1);
    sVar9 = strlen(pcVar1);
    __s1 = (char *)operator_new__(sVar9 + 1);
    iVar8 = __isoc99_sscanf(pcVar1,"%[^,],%s",pcVar10,__s1);
    if (iVar8 == 1) {
      local_70 = argv[iVar12];
    }
    else {
      iVar8 = strcmp(__s1,"txt");
      if (iVar8 == 0) {
        local_78 = Plain;
      }
      else {
        iVar8 = strcmp(__s1,"csv");
        if (iVar8 == 0) {
          local_78 = CSV;
        }
        else {
          iVar8 = strcmp(__s1,"lightxml");
          if (iVar8 == 0) {
            local_78 = LightXML;
          }
          else {
            iVar8 = strcmp(__s1,"xml");
            if (iVar8 == 0) {
              local_78 = XML;
            }
            else {
              iVar8 = strcmp(__s1,"junitxml");
              local_78 = JUnitXML;
              if (iVar8 != 0) {
                iVar8 = strcmp(__s1,"xunitxml");
                if (iVar8 == 0) {
                  qtest_qParseArgs();
                }
                else {
                  iVar8 = strcmp(__s1,"teamcity");
                  if (iVar8 == 0) {
                    local_78 = TeamCity;
                  }
                  else {
                    iVar8 = strcmp(__s1,"tap");
                    local_78 = TAP;
                    if (iVar8 != 0) {
LAB_0012d217:
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        qtest_qParseArgs();
LAB_0012d230:
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          qtest_qParseArgs();
LAB_0012d249:
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            qtest_qParseArgs();
LAB_0012d262:
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              qtest_qParseArgs();
LAB_0012d27b:
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                qtest_qParseArgs();
LAB_0012d294:
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  qtest_qParseArgs();
                                  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                                    qtest_qParseArgs();
                                  }
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    _Unwind_Resume(extraout_RAX);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_0012d381;
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar8 = strcmp(pcVar10,"-");
      if ((iVar8 == 0) && (bVar7 = QTestLog::loggerUsingStdout(), bVar7)) goto LAB_0012d1a1;
      QTestLog::addLogger(local_78,pcVar10);
    }
    operator_delete__(pcVar10);
    operator_delete__(__s1);
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-eventdelay");
  if (iVar8 == 0) {
    iVar12 = iVar12 + 1;
    if (iVar12 < argc) {
      eventDelay = qToInt(argv[iVar12]);
      goto LAB_0012ca0d;
    }
    goto LAB_0012d156;
  }
  iVar8 = strcmp(pcVar1,"-keydelay");
  if (iVar8 == 0) {
    iVar12 = iVar12 + 1;
    if (iVar12 < argc) {
      keyDelay = qToInt(argv[iVar12]);
      goto LAB_0012ca0d;
    }
    goto LAB_0012d16f;
  }
  iVar8 = strcmp(pcVar1,"-mousedelay");
  if (iVar8 == 0) {
    iVar12 = iVar12 + 1;
    if (iVar12 < argc) {
      mouseDelay = qToInt(argv[iVar12]);
      goto LAB_0012ca0d;
    }
    goto LAB_0012d188;
  }
  iVar8 = strcmp(pcVar1,"-maxwarnings");
  if (iVar8 == 0) {
    iVar12 = iVar12 + 1;
    if (iVar12 < argc) {
      iVar8 = qToInt(argv[iVar12]);
      QTestLog::setMaxWarnings(iVar8);
      goto LAB_0012ca0d;
    }
    goto LAB_0012d1ba;
  }
  iVar8 = strcmp(pcVar1,"-repeat");
  if (iVar8 == 0) {
    iVar12 = iVar12 + 1;
    if (iVar12 < argc) {
      repetitions = qToInt(argv[iVar12]);
      goto LAB_0012ca0d;
    }
    goto LAB_0012d1d3;
  }
  iVar8 = strcmp(pcVar1,"-nocrashhandler");
  if (iVar8 == 0) {
    Internal::noCrashHandler = 1;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-skipblacklisted");
  if (iVar8 == 0) {
    skipBlacklisted = 1;
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-callgrind");
  if (iVar8 == 0) {
    bVar7 = QBenchmarkValgrindUtils::haveValgrind();
    if (bVar7) {
      QDir::currentPath();
      QFileInfo::QFileInfo(local_40,&local_58);
      cVar6 = QFileInfo::isWritable();
      QFileInfo::~QFileInfo(local_40);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar6 == '\0') {
        qtest_qParseArgs();
      }
      else {
        QBenchmarkGlobalData::setMode(QBenchmarkGlobalData::current,CallgrindParentProcess);
      }
    }
    else {
      qtest_qParseArgs();
    }
    goto LAB_0012ca0d;
  }
  iVar8 = strcmp(pcVar1,"-callgrindchild");
  if (iVar8 == 0) {
    QBenchmarkGlobalData::setMode(QBenchmarkGlobalData::current,CallgrindChildProcess);
    QBenchmarkValgrindUtils::outFileBase(&local_58,-1);
    pQVar5 = QBenchmarkGlobalData::current;
    pQVar2 = &((QBenchmarkGlobalData::current->callgrindOutFileBase).d.d)->super_QArrayData;
    pcVar3 = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.ptr;
    (QBenchmarkGlobalData::current->callgrindOutFileBase).d.d = local_58.d.d;
    (pQVar5->callgrindOutFileBase).d.ptr = local_58.d.ptr;
    qVar4 = (pQVar5->callgrindOutFileBase).d.size;
    (pQVar5->callgrindOutFileBase).d.size = local_58.d.size;
    local_58.d.d = (Data *)pQVar2;
    local_58.d.ptr = pcVar3;
    local_58.d.size = qVar4;
    goto LAB_0012cdae;
  }
  iVar8 = strcmp(pcVar1,"-perf");
  if (iVar8 == 0) {
    bVar7 = QBenchmarkPerfEventsMeasurer::isAvailable();
    if (bVar7) {
      mode = PerfCounter;
      goto LAB_0012ce3e;
    }
    qtest_qParseArgs();
  }
  else {
    iVar8 = strcmp(pcVar1,"-perfcounter");
    if (iVar8 == 0) {
      iVar12 = iVar12 + 1;
      if (argc <= iVar12) goto LAB_0012d230;
      QBenchmarkPerfEventsMeasurer::setCounter(argv[iVar12]);
      goto LAB_0012ca0d;
    }
    iVar8 = strcmp(pcVar1,"-perfcounterlist");
    if (iVar8 == 0) goto LAB_0012d1ec;
    iVar8 = strcmp(pcVar1,"-tickcounter");
    if (iVar8 == 0) {
      mode = TickCounter;
    }
    else {
      iVar8 = strcmp(pcVar1,"-eventcounter");
      if (iVar8 != 0) {
        iVar8 = strcmp(pcVar1,"-minimumvalue");
        if (iVar8 == 0) {
          iVar12 = iVar12 + 1;
          if (argc <= iVar12) goto LAB_0012d249;
          iVar8 = qToInt(argv[iVar12]);
          QBenchmarkGlobalData::current->walltimeMinimum = iVar8;
        }
        else {
          iVar8 = strcmp(pcVar1,"-minimumtotal");
          if (iVar8 == 0) {
            iVar12 = iVar12 + 1;
            if (argc <= iVar12) goto LAB_0012d262;
            iVar8 = qToInt(argv[iVar12]);
            QBenchmarkGlobalData::current->minimumTotal = iVar8;
          }
          else {
            iVar8 = strcmp(pcVar1,"-iterations");
            if (iVar8 == 0) {
              iVar12 = iVar12 + 1;
              if (argc <= iVar12) goto LAB_0012d27b;
              iVar8 = qToInt(argv[iVar12]);
              QBenchmarkGlobalData::current->iterationCount = iVar8;
            }
            else {
              iVar8 = strcmp(pcVar1,"-median");
              if (iVar8 == 0) {
                iVar12 = iVar12 + 1;
                if (argc <= iVar12) goto LAB_0012d294;
                iVar8 = qToInt(argv[iVar12]);
                QBenchmarkGlobalData::current->medianIterationCount = iVar8;
                goto LAB_0012ca0d;
              }
              iVar8 = strcmp(pcVar1,"-vb");
              if (iVar8 != 0) {
                if (*pcVar1 != '-') {
                  iVar8 = 0;
                  do {
                    if (pcVar1[iVar8] == ':') {
                      if (pcVar1[(long)iVar8 + 1] != ':') goto LAB_0012cf26;
                      iVar8 = iVar8 + 1;
                    }
                    else if (pcVar1[iVar8] == '\0') goto LAB_0012cf21;
                    iVar8 = iVar8 + 1;
                  } while( true );
                }
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  qtest_qParseArgs();
                  goto LAB_0012d217;
                }
                goto LAB_0012d381;
              }
              QBenchmarkGlobalData::current->verboseOutput = true;
            }
          }
        }
        goto LAB_0012ca0d;
      }
      mode = EventCounter;
    }
LAB_0012ce3e:
    QBenchmarkGlobalData::setMode(QBenchmarkGlobalData::current,mode);
  }
LAB_0012ca0d:
  iVar12 = iVar12 + 1;
  if (argc <= iVar12) goto LAB_0012d042;
  goto LAB_0012c609;
LAB_0012cf21:
  iVar8 = -1;
LAB_0012cf26:
  if (iVar8 == -1) {
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar10 = pcVar1 + 1 + (long)psVar11;
      psVar11 = psVar11 + 1;
    } while (*pcVar10 != '\0');
    QVar14.m_data = psVar11;
    QVar14.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar14);
    QList<QString>::operator+=((QList<QString> *)testFunctions,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    QList<QString>::operator+=((QList<QString> *)&testTags,&local_58);
  }
  else {
    QString::fromLatin1(&local_58,pcVar1,(long)iVar8);
    QList<QString>::operator+=((QList<QString> *)testFunctions,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = argv[iVar12] + (long)iVar8 + 2 + (long)psVar11;
      psVar11 = psVar11 + 1;
    } while (*pcVar1 != '\0');
    QVar13.m_data = psVar11;
    QVar13.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar13);
    QList<QString>::operator+=((QList<QString> *)&testTags,&local_58);
  }
LAB_0012cdae:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  goto LAB_0012ca0d;
}

Assistant:

Q_TESTLIB_EXPORT void qtest_qParseArgs(int argc, const char *const argv[], bool qml)
{
    int logFormat = -1; // Not set
    const char *logFilename = nullptr;

    repetitions = 1;

    QTest::testFunctions.clear();
    QTest::testTags.clear();

#if defined(Q_OS_DARWIN) && defined(HAVE_XCTEST)
    if (QXcodeTestLogger::canLogTestProgress())
        logFormat = QTestLog::XCTest;
#endif

    const char *testOptions =
         " New-style logging options:\n"
         " -o filename,format  : Output results to file in the specified format\n"
         "                       Use - to output to stdout\n"
         "                       Valid formats are:\n"
         "                         txt      : Plain text\n"
         "                         csv      : CSV format (suitable for benchmarks)\n"
         "                         junitxml : XML JUnit document\n"
         "                         xml      : XML document\n"
         "                         lightxml : A stream of XML tags\n"
         "                         teamcity : TeamCity format\n"
         "                         tap      : Test Anything Protocol\n"
         "\n"
         "     *** Multiple loggers can be specified, but at most one can log to stdout.\n"
         "\n"
         " Old-style logging options:\n"
         " -o filename         : Write the output into file\n"
         " -txt                : Output results in Plain Text\n"
         " -csv                : Output results in a CSV format (suitable for benchmarks)\n"
         " -junitxml           : Output results as XML JUnit document\n"
         " -xml                : Output results as XML document\n"
         " -lightxml           : Output results as stream of XML tags\n"
         " -teamcity           : Output results in TeamCity format\n"
         " -tap                : Output results in Test Anything Protocol format\n"
         "\n"
         "     *** If no output file is specified, stdout is assumed.\n"
         "     *** If no output format is specified, -txt is assumed.\n"
         "\n"
         " Test log detail options:\n"
         " -silent             : Log failures and fatal errors only\n"
         " -v1                 : Log the start of each testfunction\n"
         " -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n"
         " -vs                 : Log every signal emission and resulting slot invocations\n"
         "\n"
         "     *** The -silent and -v1 options only affect plain text output.\n"
         "\n"
         " Testing options:\n"
         " -functions          : Returns a list of current testfunctions\n"
         " -datatags           : Returns a list of current data tags.\n"
         "                       A global data tag is preceded by ' __global__ '.\n"
         " -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n"
         " -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n"
         " -mousedelay ms      : Set default delay for mouse simulation to ms milliseconds\n"
         " -maxwarnings n      : Sets the maximum amount of messages to output.\n"
         "                       0 means unlimited, default: 2000\n"
         " -nocrashhandler     : Disables the crash handler. Useful for debugging crashes.\n"
         " -repeat n           : Run the testsuite n times or until the test fails.\n"
         "                       Useful for finding flaky tests. If negative, the tests are\n"
         "                       repeated forever. This is intended as a developer tool, and\n"
         "                       is only supported with the plain text logger.\n"
         " -skipblacklisted    : Skip blacklisted tests. Useful for measuring test coverage.\n"
         "\n"
         " Benchmarking options:\n"
#if QT_CONFIG(valgrind)
         " -callgrind          : Use callgrind to time benchmarks\n"
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
         " -perf               : Use Linux perf events to time benchmarks\n"
         " -perfcounter name   : Use the counter named 'name'\n"
         " -perfcounterlist    : Lists the counters available\n"
#endif
#ifdef HAVE_TICK_COUNTER
         " -tickcounter        : Use CPU tick counters to time benchmarks\n"
#endif
         " -eventcounter       : Counts events received during benchmarks\n"
         " -minimumvalue n     : Sets the minimum acceptable measurement value\n"
         " -minimumtotal n     : Sets the minimum acceptable total for repeated executions of a test function\n"
         " -iterations  n      : Sets the number of accumulation iterations.\n"
         " -median  n          : Sets the number of median iterations.\n"
         " -vb                 : Print out verbose benchmarking information.\n";

    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "-help") == 0 || strcmp(argv[i], "--help") == 0
            || strcmp(argv[i], "/?") == 0) {
            std::printf(" Usage: %s [options] [testfunction[:testdata]]...\n"
                        "    By default, all testfunctions will be run.\n\n"
                        "%s", argv[0], testOptions);

            if (qml) {
                std::printf("\n"
                            " QmlTest options:\n"
                            " -import dir         : Specify an import directory.\n"
                            " -plugins dir        : Specify a directory where to search for plugins.\n"
                            " -input dir/file     : Specify the root directory for test cases or a single test case file.\n"
                            " -translation file   : Specify the translation file.\n"
                            " -file-selector dir  : Specify a file selector for the QML engine.\n");
            }

            std::printf("\n"
                        " -help               : This help\n");
            exit(0);
        } else if (strcmp(argv[i], "-functions") == 0) {
            if (qml) {
                QTest::printAvailableFunctions = true;
            } else {
                qPrintTestSlots(stdout);
                exit(0);
            }
        } else if (strcmp(argv[i], "-datatags") == 0) {
            if (!qml) {
                qPrintDataTags(stdout);
                exit(0);
            }
        } else if (strcmp(argv[i], "-txt") == 0) {
            logFormat = QTestLog::Plain;
        } else if (strcmp(argv[i], "-csv") == 0) {
            logFormat = QTestLog::CSV;
        } else if (strcmp(argv[i], "-junitxml") == 0)  {
            logFormat = QTestLog::JUnitXML;
        } else if (strcmp(argv[i], "-xunitxml") == 0)  {
            std::fprintf(stderr, "WARNING: xunitxml is deprecated. Please use junitxml.\n");
            logFormat = QTestLog::JUnitXML;
        } else if (strcmp(argv[i], "-xml") == 0) {
            logFormat = QTestLog::XML;
        } else if (strcmp(argv[i], "-lightxml") == 0) {
            logFormat = QTestLog::LightXML;
        } else if (strcmp(argv[i], "-teamcity") == 0) {
            logFormat = QTestLog::TeamCity;
        } else if (strcmp(argv[i], "-tap") == 0) {
            logFormat = QTestLog::TAP;
        } else if (strcmp(argv[i], "-silent") == 0) {
            QTestLog::setVerboseLevel(-1);
        } else if (strcmp(argv[i], "-v1") == 0) {
            QTestLog::setVerboseLevel(1);
        } else if (strcmp(argv[i], "-v2") == 0) {
            QTestLog::setVerboseLevel(2);
        } else if (strcmp(argv[i], "-vs") == 0) {
            QSignalDumper::setEnabled(true);
        } else if (strcmp(argv[i], "-o") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-o needs an extra parameter specifying the filename and optional format\n");
                exit(1);
            }
            ++i;
            // Do we have the old or new style -o option?
            char *filename = new char[strlen(argv[i])+1];
            char *format = new char[strlen(argv[i])+1];
            if (std::sscanf(argv[i], "%[^,],%s", filename, format) == 1) {
                // Old-style
                logFilename = argv[i];
            } else {
                // New-style
                if (strcmp(format, "txt") == 0)
                    logFormat = QTestLog::Plain;
                else if (strcmp(format, "csv") == 0)
                    logFormat = QTestLog::CSV;
                else if (strcmp(format, "lightxml") == 0)
                    logFormat = QTestLog::LightXML;
                else if (strcmp(format, "xml") == 0)
                    logFormat = QTestLog::XML;
                else if (strcmp(format, "junitxml") == 0)
                    logFormat = QTestLog::JUnitXML;
                else if (strcmp(format, "xunitxml") == 0) {
                    std::fprintf(stderr, "WARNING: xunitxml is deprecated. Please use junitxml.\n");
                    logFormat = QTestLog::JUnitXML;
                } else if (strcmp(format, "teamcity") == 0)
                    logFormat = QTestLog::TeamCity;
                else if (strcmp(format, "tap") == 0)
                    logFormat = QTestLog::TAP;
                else {
                    std::fprintf(stderr, "output format must be one of txt, csv, lightxml, xml, tap, teamcity or junitxml\n");
                    exit(1);
                }
                if (strcmp(filename, "-") == 0 && QTestLog::loggerUsingStdout()) {
                    std::fprintf(stderr, "only one logger can log to stdout\n");
                    exit(1);
                }
                QTestLog::addLogger(QTestLog::LogMode(logFormat), filename);
            }
            delete [] filename;
            delete [] format;
        } else if (strcmp(argv[i], "-eventdelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-eventdelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::eventDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-keydelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-keydelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::keyDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-mousedelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-mousedelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::mouseDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-maxwarnings") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-maxwarnings needs an extra parameter with the amount of warnings\n");
                exit(1);
            } else {
                QTestLog::setMaxWarnings(qToInt(argv[++i]));
            }
        } else if (strcmp(argv[i], "-repeat") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-repeat needs an extra parameter for the number of repetitions\n");
                exit(1);
            } else {
                repetitions = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-nocrashhandler") == 0) {
            QTest::Internal::noCrashHandler = true;
        } else if (strcmp(argv[i], "-skipblacklisted") == 0) {
            QTest::skipBlacklisted = true;
#if QT_CONFIG(valgrind)
        } else if (strcmp(argv[i], "-callgrind") == 0) {
            if (!QBenchmarkValgrindUtils::haveValgrind()) {
                std::fprintf(stderr,
                             "WARNING: Valgrind not found or too old. "
                             "Make sure it is installed and in your path. "
                             "Using the walltime measurer.\n");
            } else if (QFileInfo(QDir::currentPath()).isWritable()) {
                QBenchmarkGlobalData::current->setMode(
                    QBenchmarkGlobalData::CallgrindParentProcess);
            } else {
                std::fprintf(stderr,
                             "WARNING: Current directory not writable. "
                             "Using the walltime measurer.\n");
            }
        } else if (strcmp(argv[i], "-callgrindchild") == 0) { // "private" option
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::CallgrindChildProcess);
            QBenchmarkGlobalData::current->callgrindOutFileBase =
                QBenchmarkValgrindUtils::outFileBase();
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
        } else if (strcmp(argv[i], "-perf") == 0) {
            if (QBenchmarkPerfEventsMeasurer::isAvailable()) {
                // perf available
                QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::PerfCounter);
            } else {
                std::fprintf(stderr, "WARNING: Linux perf events not available. Using the walltime measurer.\n");
            }
        } else if (strcmp(argv[i], "-perfcounter") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-perfcounter needs an extra parameter with the name of the counter\n");
                exit(1);
            } else {
                QBenchmarkPerfEventsMeasurer::setCounter(argv[++i]);
            }
        } else if (strcmp(argv[i], "-perfcounterlist") == 0) {
            QBenchmarkPerfEventsMeasurer::listCounters();
            exit(0);
#endif
#ifdef HAVE_TICK_COUNTER
        } else if (strcmp(argv[i], "-tickcounter") == 0) {
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::TickCounter);
#endif
        } else if (strcmp(argv[i], "-eventcounter") == 0) {
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::EventCounter);
        } else if (strcmp(argv[i], "-minimumvalue") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-minimumvalue needs an extra parameter to indicate the minimum time(ms)\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->walltimeMinimum = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-minimumtotal") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-minimumtotal needs an extra parameter to indicate the minimum total measurement\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->minimumTotal = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-iterations") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-iterations needs an extra parameter to indicate the number of iterations\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->iterationCount = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-median") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-median needs an extra parameter to indicate the number of median iterations\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->medianIterationCount = qToInt(argv[++i]);
            }

        } else if (strcmp(argv[i], "-vb") == 0) {
            QBenchmarkGlobalData::current->verboseOutput = true;
#if defined(Q_OS_DARWIN)
        } else if (strncmp(argv[i], "-Apple", 6) == 0) {
            i += 1; // Skip Apple-specific user preferences
            continue;
# if defined(HAVE_XCTEST)
        } else if (int skip = QXcodeTestLogger::parseCommandLineArgument(argv[i])) {
            i += (skip - 1); // Eating argv[i] with a continue counts towards skips
            continue;
# endif
#endif
        } else if (argv[i][0] == '-') {
            std::fprintf(stderr, "Unknown option: '%s'\n\n%s", argv[i], testOptions);
            if (qml) {
                std::fprintf(stderr, "\nqmltest related options:\n"
                                     " -import    : Specify an import directory.\n"
                                     " -plugins   : Specify a directory where to search for plugins.\n"
                                     " -input     : Specify the root directory for test cases.\n");
            }

            std::fprintf(stderr, "\n"
                                 " -help      : This help\n");
            exit(1);
        } else {
            // We can't check the availability of test functions until
            // we load the QML files.  So just store the data for now.
            int colon = -1;
            int offset;
            for (offset = 0; argv[i][offset]; ++offset) {
                if (argv[i][offset] == ':') {
                    if (argv[i][offset + 1] == ':') {
                        // "::" is used as a test name separator.
                        // e.g. "ClickTests::test_click:row1".
                        ++offset;
                    } else {
                        colon = offset;
                        break;
                    }
                }
            }
            if (colon == -1) {
                QTest::testFunctions += QString::fromLatin1(argv[i]);
                QTest::testTags += QString();
            } else {
                QTest::testFunctions +=
                    QString::fromLatin1(argv[i], colon);
                QTest::testTags +=
                    QString::fromLatin1(argv[i] + colon + 1);
            }
        }
    }

    bool installedTestCoverage = installCoverageTool(QTestResult::currentAppName(), QTestResult::currentTestObjectName());
    QTestLog::setInstalledTestCoverage(installedTestCoverage);

    // If no loggers were created by the long version of the -o command-line
    // option, but a logger was requested via the old-style option, add it.
    const bool explicitLoggerRequested = logFormat != -1;
    if (!QTestLog::hasLoggers() && explicitLoggerRequested)
        QTestLog::addLogger(QTestLog::LogMode(logFormat), logFilename);

    bool addFallbackLogger = !explicitLoggerRequested;

#if defined(QT_USE_APPLE_UNIFIED_LOGGING)
    // Any explicitly requested loggers will be added by now, so we can check if they use stdout
    const bool safeToAddAppleLogger = !AppleUnifiedLogger::preventsStderrLogging() || !QTestLog::loggerUsingStdout();
    if (safeToAddAppleLogger && QAppleTestLogger::debugLoggingEnabled()) {
        QTestLog::addLogger(QTestLog::Apple, nullptr);
        if (AppleUnifiedLogger::preventsStderrLogging() && !logFilename)
            addFallbackLogger = false; // Prevent plain test logger fallback below
    }
#endif

    if (addFallbackLogger)
        QTestLog::addLogger(QTestLog::Plain, logFilename);

    if (repetitions != 1 && !QTestLog::isRepeatSupported()) {
        std::fprintf(stderr, "-repeat is only supported with plain text logger\n");
        exit(1);
    }
}